

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

bool __thiscall sptk::reaper::EpochTracker::WriteDiagnostics(EpochTracker *this,string *file_base)

{
  pointer pTVar1;
  FILE *__s;
  char *__format;
  int32_t i;
  uint uVar2;
  uint uVar3;
  string pm_name;
  allocator local_69;
  float time;
  vector<float,_std::allocator<float>_> f0;
  
  if (file_base->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->debug_name_);
  }
  std::__cxx11::string::string((string *)&pm_name,"pcm",(allocator *)&time);
  WriteDebugData(this,&this->signal_,&pm_name);
  std::__cxx11::string::~string((string *)&pm_name);
  std::__cxx11::string::string((string *)&pm_name,"resid",(allocator *)&time);
  WriteDebugData(this,&this->residual_,&pm_name);
  std::__cxx11::string::~string((string *)&pm_name);
  std::__cxx11::string::string((string *)&pm_name,"nresid",(allocator *)&time);
  WriteDebugData(this,&this->norm_residual_,&pm_name);
  std::__cxx11::string::~string((string *)&pm_name);
  std::__cxx11::string::string((string *)&pm_name,"bprms",(allocator *)&time);
  WriteDebugData(this,&this->bandpassed_rms_,&pm_name);
  std::__cxx11::string::~string((string *)&pm_name);
  std::__cxx11::string::string((string *)&pm_name,"onsetp",(allocator *)&time);
  WriteDebugData(this,&this->voice_onset_prob_,&pm_name);
  std::__cxx11::string::~string((string *)&pm_name);
  std::__cxx11::string::string((string *)&pm_name,"offsetp",(allocator *)&time);
  WriteDebugData(this,&this->voice_offset_prob_,&pm_name);
  std::__cxx11::string::~string((string *)&pm_name);
  std::__cxx11::string::string((string *)&pm_name,"pvals",(allocator *)&time);
  WriteDebugData(this,&this->peaks_debug_,&pm_name);
  std::__cxx11::string::~string((string *)&pm_name);
  std::__cxx11::string::string((string *)&pm_name,"pvoiced",(allocator *)&time);
  WriteDebugData(this,&this->prob_voiced_,&pm_name);
  std::__cxx11::string::~string((string *)&pm_name);
  std::__cxx11::string::string((string *)&pm_name,"bestcorr",(allocator *)&time);
  WriteDebugData(this,&this->best_corr_,&pm_name);
  std::__cxx11::string::~string((string *)&pm_name);
  if (((this->debug_name_)._M_string_length != 0) &&
     (0x20 < (ulong)((long)(this->output_).
                           super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->output_).
                          super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                          ._M_impl.super__Vector_impl_data._M_start))) {
    std::operator+(&pm_name,&this->debug_name_,".pmlab");
    __s = fopen(pm_name._M_dataplus._M_p,"w");
    fwrite("#\n",2,1,__s);
    f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    f0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uVar3 = (int)((ulong)((long)(this->output_).
                                super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->output_).
                               super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1;
    for (uVar2 = uVar3; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
      pTVar1 = (this->output_).
               super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ._M_impl.super__Vector_impl_data._M_start;
      time = (float)pTVar1[uVar2].resid_index / this->sample_rate_;
      __format = "%f blue \n";
      if ((pTVar1[uVar2].voiced == false) &&
         (((int)uVar3 <= (int)uVar2 ||
          (__format = "%f blue \n", pTVar1[(ulong)uVar2 + 1].voiced == false)))) {
        __format = "%f red \n";
      }
      fprintf(__s,__format,SUB84((double)time,0));
      std::vector<float,_std::allocator<float>_>::push_back(&f0,&time);
      std::vector<float,_std::allocator<float>_>::push_back
                (&f0,&(this->output_).
                      super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar2].f0);
      std::vector<float,_std::allocator<float>_>::push_back
                (&f0,&(this->output_).
                      super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar2].nccf_value);
    }
    fclose(__s);
    std::__cxx11::string::string((string *)&time,"f0ap",&local_69);
    WriteDebugData(this,&f0,(string *)&time);
    std::__cxx11::string::~string((string *)&time);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&f0.super__Vector_base<float,_std::allocator<float>_>);
    std::__cxx11::string::~string((string *)&pm_name);
  }
  return true;
}

Assistant:

bool EpochTracker::WriteDiagnostics(const std::string& file_base) {
  if (!file_base.empty()) {
    set_debug_name(file_base);
  }
  WriteDebugData(signal_, "pcm");
  WriteDebugData(residual_, "resid");
  WriteDebugData(norm_residual_, "nresid");
  WriteDebugData(bandpassed_rms_, "bprms");
  WriteDebugData(voice_onset_prob_, "onsetp");
  WriteDebugData(voice_offset_prob_, "offsetp");
  WriteDebugData(peaks_debug_, "pvals");
  WriteDebugData(prob_voiced_, "pvoiced");
  // best_corr_ is only available after CreatePeriodLattice.
  WriteDebugData(best_corr_, "bestcorr");
  // NOTE: if WriteDiagnostics is called before the
  // DynamicProgramming, there will be nothing in output_.
  if ((!debug_name_.empty()) && (output_.size() > 2)) {
    std::string pm_name = debug_name_ + ".pmlab";
    FILE* pmfile = fopen(pm_name.c_str(), "w");
    fprintf(pmfile, "#\n");
    std::vector<float> f0;
    int32_t limit = output_.size() - 1;
    // Produce debug output in normal time order.
    for (int32_t i = limit; i >= 0; --i) {
      float time = output_[i].resid_index / sample_rate_;
      // Note that the pulse locations of both the beginning and end
      // of any voiced period are of interest.
      if (output_[i].voiced || ((i < limit) && (output_[i+1].voiced))) {
        fprintf(pmfile, "%f blue \n", time);
      } else {
        fprintf(pmfile, "%f red \n", time);
      }
      f0.push_back(time);
      f0.push_back(output_[i].f0);
      f0.push_back(output_[i].nccf_value);
    }
    fclose(pmfile);
    WriteDebugData(f0, "f0ap");
  }
  return true;
}